

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O2

AMQP_VALUE amqpvalue_create_sasl_outcome(SASL_OUTCOME_HANDLE sasl_outcome)

{
  AMQP_VALUE pAVar1;
  
  if (sasl_outcome != (SASL_OUTCOME_HANDLE)0x0) {
    pAVar1 = amqpvalue_clone(sasl_outcome->composite_value);
    return pAVar1;
  }
  return (AMQP_VALUE)0x0;
}

Assistant:

AMQP_VALUE amqpvalue_create_sasl_outcome(SASL_OUTCOME_HANDLE sasl_outcome)
{
    AMQP_VALUE result;

    if (sasl_outcome == NULL)
    {
        result = NULL;
    }
    else
    {
        SASL_OUTCOME_INSTANCE* sasl_outcome_instance = (SASL_OUTCOME_INSTANCE*)sasl_outcome;
        result = amqpvalue_clone(sasl_outcome_instance->composite_value);
    }

    return result;
}